

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes_enums.h
# Opt level: O2

char * MLFeatureTypeType_Name(MLFeatureTypeType x)

{
  if (x < (MLFeatureTypeType_stateType|MLFeatureTypeType_int64Type)) {
    return &DAT_00309a84 + *(int *)(&DAT_00309a84 + (ulong)x * 4);
  }
  return "INVALID";
}

Assistant:

__attribute__((__unused__))
static const char * MLFeatureTypeType_Name(MLFeatureTypeType x) {
    switch (x) {
        case MLFeatureTypeType_int64Type:
            return "MLFeatureTypeType_int64Type";
        case MLFeatureTypeType_doubleType:
            return "MLFeatureTypeType_doubleType";
        case MLFeatureTypeType_stringType:
            return "MLFeatureTypeType_stringType";
        case MLFeatureTypeType_imageType:
            return "MLFeatureTypeType_imageType";
        case MLFeatureTypeType_multiArrayType:
            return "MLFeatureTypeType_multiArrayType";
        case MLFeatureTypeType_dictionaryType:
            return "MLFeatureTypeType_dictionaryType";
        case MLFeatureTypeType_sequenceType:
            return "MLFeatureTypeType_sequenceType";
        case MLFeatureTypeType_stateType:
            return "MLFeatureTypeType_stateType";
        case MLFeatureTypeType_NOT_SET:
            return "INVALID";
    }
    return "INVALID";
}